

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

void Vec_IntPush(Vec_Int_t *p,int Entry)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  
  uVar1 = p->nCap;
  if (p->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar2 = (int *)malloc(0x40);
      }
      else {
        piVar2 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_0092953d;
      if (p->pArray == (int *)0x0) {
        piVar2 = (int *)malloc((ulong)uVar1 << 3);
      }
      else {
        piVar2 = (int *)realloc(p->pArray,(ulong)uVar1 << 3);
      }
      p->pArray = piVar2;
    }
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = iVar3;
  }
LAB_0092953d:
  iVar3 = p->nSize;
  p->nSize = iVar3 + 1;
  p->pArray[iVar3] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPush( Vec_Int_t * p, int Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}